

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

StringRef llvm::Triple::getOSTypeName(OSType Kind)

{
  undefined1 auStack_218 [4];
  OSType Kind_local;
  char *local_208;
  undefined1 *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  undefined1 *local_190;
  char *local_188;
  undefined1 *local_180;
  char *local_178;
  undefined1 *local_170;
  char *local_168;
  undefined1 *local_160;
  char *local_158;
  undefined1 *local_150;
  char *local_148;
  undefined1 *local_140;
  char *local_138;
  undefined1 *local_130;
  char *local_128;
  undefined1 *local_120;
  char *local_118;
  undefined1 *local_110;
  char *local_108;
  undefined1 *local_100;
  char *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  char *local_98;
  undefined1 *local_90;
  char *local_88;
  undefined1 *local_80;
  char *local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 *local_40;
  char *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  char *local_18;
  undefined1 *local_10;
  
  switch(Kind) {
  case UnknownOS:
    local_200 = auStack_218;
    local_208 = "unknown";
    strlen("unknown");
    break;
  case Ananas:
    local_1f0 = auStack_218;
    local_1f8 = "ananas";
    strlen("ananas");
    break;
  case CloudABI:
    local_1e0 = auStack_218;
    local_1e8 = "cloudabi";
    strlen("cloudabi");
    break;
  case Darwin:
    local_1d0 = auStack_218;
    local_1d8 = "darwin";
    strlen("darwin");
    break;
  case DragonFly:
    local_1c0 = auStack_218;
    local_1c8 = "dragonfly";
    strlen("dragonfly");
    break;
  case FreeBSD:
    local_1b0 = auStack_218;
    local_1b8 = "freebsd";
    strlen("freebsd");
    break;
  case Fuchsia:
    local_1a0 = auStack_218;
    local_1a8 = "fuchsia";
    strlen("fuchsia");
    break;
  case IOS:
    local_190 = auStack_218;
    local_198 = "ios";
    strlen("ios");
    break;
  case KFreeBSD:
    local_180 = auStack_218;
    local_188 = "kfreebsd";
    strlen("kfreebsd");
    break;
  case Linux:
    local_170 = auStack_218;
    local_178 = "linux";
    strlen("linux");
    break;
  case Lv2:
    local_160 = auStack_218;
    local_168 = "lv2";
    strlen("lv2");
    break;
  case MacOSX:
    local_150 = auStack_218;
    local_158 = "macosx";
    strlen("macosx");
    break;
  case NetBSD:
    local_140 = auStack_218;
    local_148 = "netbsd";
    strlen("netbsd");
    break;
  case OpenBSD:
    local_130 = auStack_218;
    local_138 = "openbsd";
    strlen("openbsd");
    break;
  case Solaris:
    local_120 = auStack_218;
    local_128 = "solaris";
    strlen("solaris");
    break;
  case Win32:
    local_110 = auStack_218;
    local_118 = "windows";
    strlen("windows");
    break;
  case Haiku:
    local_100 = auStack_218;
    local_108 = "haiku";
    strlen("haiku");
    break;
  case Minix:
    local_f0 = auStack_218;
    local_f8 = "minix";
    strlen("minix");
    break;
  case RTEMS:
    local_e0 = auStack_218;
    local_e8 = "rtems";
    strlen("rtems");
    break;
  case NaCl:
    local_d0 = auStack_218;
    local_d8 = "nacl";
    strlen("nacl");
    break;
  case CNK:
    local_c0 = auStack_218;
    local_c8 = "cnk";
    strlen("cnk");
    break;
  case AIX:
    local_b0 = auStack_218;
    local_b8 = "aix";
    strlen("aix");
    break;
  case CUDA:
    local_a0 = auStack_218;
    local_a8 = "cuda";
    strlen("cuda");
    break;
  case NVCL:
    local_90 = auStack_218;
    local_98 = "nvcl";
    strlen("nvcl");
    break;
  case AMDHSA:
    local_80 = auStack_218;
    local_88 = "amdhsa";
    strlen("amdhsa");
    break;
  case PS4:
    local_70 = auStack_218;
    local_78 = "ps4";
    strlen("ps4");
    break;
  case ELFIAMCU:
    local_60 = auStack_218;
    local_68 = "elfiamcu";
    strlen("elfiamcu");
    break;
  case TvOS:
    local_50 = auStack_218;
    local_58 = "tvos";
    strlen("tvos");
    break;
  case WatchOS:
    local_40 = auStack_218;
    local_48 = "watchos";
    strlen("watchos");
    break;
  case Mesa3D:
    local_30 = auStack_218;
    local_38 = "mesa3d";
    strlen("mesa3d");
    break;
  case Contiki:
    local_20 = auStack_218;
    local_28 = "contiki";
    strlen("contiki");
    break;
  case AMDPAL:
    local_10 = auStack_218;
    local_18 = "amdpal";
    strlen("amdpal");
    break;
  default:
    llvm_unreachable_internal
              ("Invalid OSType",
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
               ,0xd6);
  }
  return _auStack_218;
}

Assistant:

StringRef Triple::getOSTypeName(OSType Kind) {
  switch (Kind) {
  case UnknownOS: return "unknown";

  case Ananas: return "ananas";
  case CloudABI: return "cloudabi";
  case Darwin: return "darwin";
  case DragonFly: return "dragonfly";
  case FreeBSD: return "freebsd";
  case Fuchsia: return "fuchsia";
  case IOS: return "ios";
  case KFreeBSD: return "kfreebsd";
  case Linux: return "linux";
  case Lv2: return "lv2";
  case MacOSX: return "macosx";
  case NetBSD: return "netbsd";
  case OpenBSD: return "openbsd";
  case Solaris: return "solaris";
  case Win32: return "windows";
  case Haiku: return "haiku";
  case Minix: return "minix";
  case RTEMS: return "rtems";
  case NaCl: return "nacl";
  case CNK: return "cnk";
  case AIX: return "aix";
  case CUDA: return "cuda";
  case NVCL: return "nvcl";
  case AMDHSA: return "amdhsa";
  case PS4: return "ps4";
  case ELFIAMCU: return "elfiamcu";
  case TvOS: return "tvos";
  case WatchOS: return "watchos";
  case Mesa3D: return "mesa3d";
  case Contiki: return "contiki";
  case AMDPAL: return "amdpal";
  }

  llvm_unreachable("Invalid OSType");
}